

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O2

string * google::protobuf::strings::Utf8SafeCEscape(string *__return_storage_ptr__,string *src)

{
  int src_len;
  int iVar1;
  scoped_array<char> dest_00;
  LogMessage *other;
  LogFinisher local_71;
  scoped_array<char> dest;
  LogMessage local_68;
  
  src_len = (int)src->_M_string_length;
  iVar1 = src_len * 4 + 1;
  dest_00.array_ = (char *)operator_new__((long)iVar1);
  dest.array_ = dest_00.array_;
  iVar1 = CEscapeInternal((src->_M_dataplus)._M_p,src_len,dest_00.array_,iVar1,false,true);
  if (iVar1 < 0) {
    protobuf::internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
               ,0x272);
    other = protobuf::internal::LogMessage::operator<<(&local_68,"CHECK failed: (len) >= (0): ");
    protobuf::internal::LogFinisher::operator=(&local_71,other);
    protobuf::internal::LogMessage::~LogMessage(&local_68);
    dest_00 = dest;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,dest_00.array_,dest_00.array_ + iVar1);
  protobuf::internal::scoped_array<char>::~scoped_array(&dest);
  return __return_storage_ptr__;
}

Assistant:

string Utf8SafeCEscape(const string& src) {
  const int dest_length = src.size() * 4 + 1; // Maximum possible expansion
  scoped_array<char> dest(new char[dest_length]);
  const int len = CEscapeInternal(src.data(), src.size(),
                                  dest.get(), dest_length, false, true);
  GOOGLE_DCHECK_GE(len, 0);
  return string(dest.get(), len);
}